

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterB.c
# Opt level: O0

void Intb_ManResize(Intb_Man_t *p)

{
  Aig_Obj_t **local_50;
  int *local_48;
  Sto_Cls_t **local_40;
  Sto_Cls_t **local_38;
  int *local_30;
  char *local_28;
  lit *local_20;
  lit *local_18;
  Intb_Man_t *p_local;
  
  p->Counter = 0;
  if (p->nVarsAlloc < p->pCnf->nVars) {
    if (p->nVarsAlloc == 0) {
      p->nVarsAlloc = 1;
    }
    while (p->nVarsAlloc < p->pCnf->nVars) {
      p->nVarsAlloc = p->nVarsAlloc << 1;
    }
    if (p->pTrail == (lit *)0x0) {
      local_18 = (lit *)malloc((long)p->nVarsAlloc << 2);
    }
    else {
      local_18 = (lit *)realloc(p->pTrail,(long)p->nVarsAlloc << 2);
    }
    p->pTrail = local_18;
    if (p->pAssigns == (lit *)0x0) {
      local_20 = (lit *)malloc((long)p->nVarsAlloc << 2);
    }
    else {
      local_20 = (lit *)realloc(p->pAssigns,(long)p->nVarsAlloc << 2);
    }
    p->pAssigns = local_20;
    if (p->pSeens == (char *)0x0) {
      local_28 = (char *)malloc((long)p->nVarsAlloc);
    }
    else {
      local_28 = (char *)realloc(p->pSeens,(long)p->nVarsAlloc);
    }
    p->pSeens = local_28;
    if (p->pVarTypes == (int *)0x0) {
      local_30 = (int *)malloc((long)p->nVarsAlloc << 2);
    }
    else {
      local_30 = (int *)realloc(p->pVarTypes,(long)p->nVarsAlloc << 2);
    }
    p->pVarTypes = local_30;
    if (p->pReasons == (Sto_Cls_t **)0x0) {
      local_38 = (Sto_Cls_t **)malloc((long)p->nVarsAlloc << 3);
    }
    else {
      local_38 = (Sto_Cls_t **)realloc(p->pReasons,(long)p->nVarsAlloc << 3);
    }
    p->pReasons = local_38;
    if (p->pWatches == (Sto_Cls_t **)0x0) {
      local_40 = (Sto_Cls_t **)malloc((long)(p->nVarsAlloc << 1) << 3);
    }
    else {
      local_40 = (Sto_Cls_t **)realloc(p->pWatches,(long)(p->nVarsAlloc << 1) << 3);
    }
    p->pWatches = local_40;
  }
  memset(p->pAssigns,0xff,(long)p->pCnf->nVars << 2);
  memset(p->pSeens,0,(long)p->pCnf->nVars);
  memset(p->pVarTypes,0,(long)p->pCnf->nVars << 2);
  memset(p->pReasons,0,(long)p->pCnf->nVars << 3);
  memset(p->pWatches,0,(long)p->pCnf->nVars << 4);
  Intb_ManGlobalVars(p);
  if (p->nClosAlloc < p->pCnf->nClauses) {
    if (p->nClosAlloc == 0) {
      p->nClosAlloc = 1;
    }
    while (p->nClosAlloc < p->pCnf->nClauses) {
      p->nClosAlloc = p->nClosAlloc << 1;
    }
    if (p->pProofNums == (int *)0x0) {
      local_48 = (int *)malloc((long)p->nClosAlloc << 2);
    }
    else {
      local_48 = (int *)realloc(p->pProofNums,(long)p->nClosAlloc << 2);
    }
    p->pProofNums = local_48;
  }
  memset(p->pProofNums,0,(long)p->pCnf->nClauses << 2);
  if (p->nIntersAlloc < p->pCnf->nClauses) {
    p->nIntersAlloc = p->pCnf->nClauses;
    if (p->pInters == (Aig_Obj_t **)0x0) {
      local_50 = (Aig_Obj_t **)malloc((long)p->nIntersAlloc << 3);
    }
    else {
      local_50 = (Aig_Obj_t **)realloc(p->pInters,(long)p->nIntersAlloc << 3);
    }
    p->pInters = local_50;
  }
  memset(p->pInters,0,(long)p->pCnf->nClauses << 3);
  return;
}

Assistant:

void Intb_ManResize( Intb_Man_t * p )
{
    p->Counter = 0;
    // check if resizing is needed
    if ( p->nVarsAlloc < p->pCnf->nVars )
    {
        // find the new size
        if ( p->nVarsAlloc == 0 )
            p->nVarsAlloc = 1;
        while ( p->nVarsAlloc < p->pCnf->nVars ) 
            p->nVarsAlloc *= 2;
        // resize the arrays
        p->pTrail    = ABC_REALLOC(lit,         p->pTrail,    p->nVarsAlloc );
        p->pAssigns  = ABC_REALLOC(lit,         p->pAssigns,  p->nVarsAlloc );
        p->pSeens    = ABC_REALLOC(char,        p->pSeens,    p->nVarsAlloc );
        p->pVarTypes = ABC_REALLOC(int,         p->pVarTypes, p->nVarsAlloc );
        p->pReasons  = ABC_REALLOC(Sto_Cls_t *, p->pReasons,  p->nVarsAlloc );
        p->pWatches  = ABC_REALLOC(Sto_Cls_t *, p->pWatches,  p->nVarsAlloc*2 );
    }

    // clean the free space
    memset( p->pAssigns , 0xff, sizeof(lit) * p->pCnf->nVars );
    memset( p->pSeens   , 0,    sizeof(char) * p->pCnf->nVars );
    memset( p->pVarTypes, 0,    sizeof(int) * p->pCnf->nVars );
    memset( p->pReasons , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars );
    memset( p->pWatches , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars*2 );

    // compute the number of common variables
    Intb_ManGlobalVars( p );

    // check if resizing of clauses is needed
    if ( p->nClosAlloc < p->pCnf->nClauses )
    {
        // find the new size
        if ( p->nClosAlloc == 0 )
            p->nClosAlloc = 1;
        while ( p->nClosAlloc < p->pCnf->nClauses ) 
            p->nClosAlloc *= 2;
        // resize the arrays
        p->pProofNums = ABC_REALLOC( int, p->pProofNums,  p->nClosAlloc );
    }
    memset( p->pProofNums, 0, sizeof(int) * p->pCnf->nClauses );

    // check if resizing of truth tables is needed
    if ( p->nIntersAlloc < p->pCnf->nClauses )
    {
        p->nIntersAlloc = p->pCnf->nClauses;
        p->pInters = ABC_REALLOC( Aig_Obj_t *, p->pInters, p->nIntersAlloc );
    }
    memset( p->pInters, 0, sizeof(Aig_Obj_t *) * p->pCnf->nClauses );
}